

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O2

char * TUPU::opErrorString(int err)

{
  char *pcVar1;
  
  if (0 < err) {
    pcVar1 = (char *)curl_easy_strerror();
    return pcVar1;
  }
  if (0xfffffff5 < (uint)err) {
    return &DAT_003c164c + *(int *)(&DAT_003c1674 + (long)err * 4);
  }
  return "";
}

Assistant:

const char * opErrorString(int err) {
    if (err > 0)
        return curl_easy_strerror((CURLcode)err);
    else if (err < 0) {
        switch (err) {
            case OPC_WRONGPARAM:
                return "Wrong parameter";
            case OPC_SIGNFAILED:
                return "Failed to sign request";
            case OPC_SENDFAILED:
                return "Failded to send request";
            case OPC_REQFAILED:
                return "Request failed";
            case OPC_PARSEFAILED:
                return "Failed to parse response data";
            case OPC_VERIFYFAILED:
                return "Failed to verify response signature";
            case OPC_OTHERS:
                return "Other unclassified error";
        }
    }
    return "";
}